

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  archive_match *in_RSI;
  archive_entry *in_RDI;
  archive_entry *unaff_retaddr;
  archive_match *in_stack_00000008;
  wchar_t magic_test;
  wchar_t r;
  archive_match *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  archive_entry *in_stack_ffffffffffffffc8;
  wchar_t local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = L'\xffffffe2';
  }
  else if (in_RSI == (archive_match *)0x0) {
    archive_set_error((archive *)in_RDI,0x16,"entry is NULL");
    local_4 = L'\xffffffe7';
  }
  else {
    local_4 = L'\0';
    if (((in_RDI->ae_stat).aest_size & 1) != 0) {
      archive_entry_pathname(in_stack_ffffffffffffffc8);
      local_4 = path_excluded(in_RSI,(wchar_t)((ulong)in_RDI >> 0x20),
                              (void *)CONCAT44(local_4,iVar1));
      if (local_4 != L'\0') {
        return local_4;
      }
    }
    if (((((in_RDI->ae_stat).aest_size & 2) == 0) ||
        (local_4 = time_excluded(in_RSI,in_RDI), local_4 == L'\0')) &&
       (((in_RDI->ae_stat).aest_size & 4) != 0)) {
      local_4 = owner_excluded(in_stack_00000008,unaff_retaddr);
    }
  }
  return local_4;
}

Assistant:

int
archive_match_excluded(struct archive *_a, struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_excluded_ae");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	r = 0;
	if (a->setflag & PATTERN_IS_SET) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = path_excluded(a, 0, archive_entry_pathname_w(entry));
#else
		r = path_excluded(a, 1, archive_entry_pathname(entry));
#endif
		if (r != 0)
			return (r);
	}

	if (a->setflag & TIME_IS_SET) {
		r = time_excluded(a, entry);
		if (r != 0)
			return (r);
	}

	if (a->setflag & ID_IS_SET)
		r = owner_excluded(a, entry);
	return (r);
}